

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tools.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* listThings(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *things,bool articles)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  byte in_DL;
  undefined7 in_register_00000031;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_248 [32];
  string local_228 [48];
  string local_1f8 [32];
  string local_1d8 [32];
  ulong local_1b8;
  size_t i;
  size_t lastIndex;
  stringstream ss;
  ostream local_198 [383];
  byte local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool articles_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *things_local;
  
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)CONCAT71(in_register_00000031,articles);
  local_19 = in_DL & 1;
  pvStack_18 = this;
  things_local = things;
  std::__cxx11::stringstream::stringstream((stringstream *)&lastIndex);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this);
  if (!bVar1) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this);
    i = sVar2 - 1;
    for (local_1b8 = 0; local_1b8 < i; local_1b8 = local_1b8 + 1) {
      if ((local_19 & 1) != 0) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this,local_1b8);
        std::__cxx11::string::string(local_1f8,(string *)pvVar3);
        getArticle(local_1d8);
        std::operator<<(local_198,(string *)local_1d8);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::string::~string(local_1f8);
      }
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this,local_1b8);
      std::operator<<(local_198,(string *)pvVar3);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this);
      if (2 < sVar2) {
        std::operator<<(local_198,",");
      }
      std::operator<<(local_198," ");
    }
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this);
    if (1 < sVar2) {
      std::operator<<(local_198,"and ");
    }
    if ((local_19 & 1) != 0) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this,i);
      std::__cxx11::string::string(local_248,(string *)pvVar3);
      getArticle(local_228);
      std::operator<<(local_198,(string *)local_228);
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::string::~string(local_248);
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this,i);
    std::operator<<(local_198,(string *)pvVar3);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&lastIndex);
  return things;
}

Assistant:

std::string listThings(std::vector<std::string> things, bool articles) {
  std::stringstream ss;

  if(!things.empty()) {
    size_t lastIndex = things.size() - 1;
    for(size_t i = 0; i < lastIndex; i++) {
      if(articles) { ss << getArticle(things[i]); }
      ss << things[i];
      if(things.size() > 2) { ss << ","; }
      ss << " ";
      //if(i < lastIndex) { ss << ", "; }
    }

    if(things.size() > 1) { ss << "and "; }
    if(articles) { ss << getArticle(things[lastIndex]); }
    ss << things[lastIndex];
  }

  return ss.str();
}